

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O2

bool FormatBoot(string *path)

{
  bool bVar1;
  int iVar2;
  shared_ptr<HDD> hdd;
  MEMORY mem;
  
  std::__cxx11::string::rfind((char)path,0x3a);
  std::__cxx11::string::substr((ulong)&mem,(ulong)path);
  HDD::OpenDisk((HDD *)&hdd,(string *)&mem);
  std::__cxx11::string::~string((string *)&mem);
  if (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
LAB_00159287:
    Error("open");
  }
  else {
    bVar1 = HDD::Seek(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    if (!bVar1) goto LAB_00159287;
    iVar2 = (*(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_HDD[2])();
    if ((char)iVar2 != '\0') {
      iVar2 = (*(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_HDD[3])();
      if ((char)iVar2 != '\0') {
        mem.size = (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sector_size;
        mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
        mem.pb = AllocMem(mem.size);
        iVar2 = HDD::Write(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr,mem.pb,1,
                           false);
        bVar1 = iVar2 != 0;
        if (!bVar1) {
          Error("write");
        }
        (*(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_HDD[4])();
        MEMORY::~MEMORY(&mem);
        goto LAB_00159295;
      }
    }
  }
  bVar1 = false;
LAB_00159295:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool FormatBoot(const std::string& path)
{
    bool fRet = false;

    // Strip ":0" from end of string
    auto hdd = HDD::OpenDisk(path.substr(0, path.rfind(':')));

    if (!hdd.get() || !hdd->Seek(0))
        Error("open");
    else if (hdd->SafetyCheck() && hdd->Lock())
    {
        MEMORY mem(hdd->sector_size);

        if (!hdd->Write(mem, 1))
            Error("write");
        else
            fRet = true;

        hdd->Unlock();
    }

    return fRet;
}